

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  color_cluster *pcVar5;
  int iVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  int iVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  color_quad_u8 color_values [4];
  vector<unsigned_char> selectors;
  color_quad_u8 block_values [4];
  results results;
  results refinerResults;
  dxt_endpoint_refiner refiner;
  float encoding_weight [8];
  dxt1_endpoint_optimizer optimizer;
  byte local_b38 [16];
  color_cluster *local_b28;
  uint local_b1c;
  elemental_vector local_b18;
  dxt_hc *local_b08;
  ulong local_b00;
  color_quad_u8 local_af8 [4];
  params local_ae8;
  ulong local_ac0;
  unsigned_long_long *local_ab8;
  uchar *local_ab0;
  float *local_aa8;
  uint *local_aa0;
  ulong local_a98;
  ulong local_a90;
  color_quad_u8 (*local_a88) [16];
  long local_a80;
  ulong local_a78;
  results local_a70;
  params local_a50;
  results local_a18;
  dxt_endpoint_refiner local_a08;
  float local_9f8 [10];
  dxt1_endpoint_optimizer local_9d0;
  
  local_b1c = this->m_pTask_pool->m_num_threads;
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&local_9d0);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&local_a08);
  local_b18.m_p = (uint8 *)0x0;
  local_b18.m_size = 0;
  local_b18.m_capacity = 0;
  uVar11 = (this->m_color_clusters).m_size;
  if ((uint)data < uVar11) {
    local_b1c = local_b1c + 1;
    local_b08 = this;
    do {
      uVar17 = (uint)data;
      uVar12 = data & 0xffffffff;
      pcVar5 = (this->m_color_clusters).m_p;
      uVar13 = pcVar5[uVar12].pixels.m_size;
      if (uVar13 != 0) {
        local_b28 = pcVar5 + uVar12;
        local_ae8.m_dxt1a_alpha_threshold = 0x80;
        local_ae8.m_grayscale_sampling = false;
        local_ae8.m_use_transparent_indices_for_black = false;
        local_ae8.m_force_alpha_blocks = false;
        local_ae8.m_pPixels = (local_b28->pixels).m_p;
        local_ae8.m_pixels_have_alpha = false;
        local_ae8.m_use_alpha_blocks = false;
        local_ae8.m_perceptual = (this->m_params).m_perceptual;
        local_ae8.m_quality = cCRNDXTQualityUber;
        local_ae8.m_endpoint_caching = false;
        local_a70.m_pSelectors = (uint8 *)0x0;
        local_ae8.m_block_index = uVar17;
        local_ae8.m_num_pixels = uVar13;
        if (local_b18.m_size != uVar13) {
          if (local_b18.m_size <= uVar13) {
            if (local_b18.m_capacity < uVar13) {
              elemental_vector::increase_capacity
                        (&local_b18,uVar13,local_b18.m_size + 1 == uVar13,1,(object_mover)0x0,false)
              ;
            }
            memset((uint8 *)((long)local_b18.m_p + (ulong)local_b18.m_size),0,
                   (ulong)(uVar13 - local_b18.m_size));
          }
          local_b18.m_size = uVar13;
        }
        local_a70.m_pSelectors = (uint8 *)local_b18.m_p;
        dxt1_endpoint_optimizer::compute(&local_9d0,&local_ae8,&local_a70);
        local_b28->first_endpoint = (uint)local_a70.m_low_color;
        local_b28->second_endpoint = (uint)local_a70.m_high_color;
        dxt1_block::get_block_colors4(local_af8,local_a70.m_low_color,local_a70.m_high_color);
        lVar14 = 0;
        do {
          bVar1 = (&g_dxt1_from_linear)[lVar14];
          bVar2 = local_af8[bVar1].field_0.field_0.r;
          pcVar5[uVar12].color_values[lVar14].field_0.field_0.r = bVar2;
          bVar3 = local_af8[bVar1].field_0.field_0.g;
          pcVar5[uVar12].color_values[lVar14].field_0.field_0.g = bVar3;
          bVar4 = local_af8[bVar1].field_0.field_0.b;
          pcVar5[uVar12].color_values[lVar14].field_0.field_0.b = bVar4;
          bVar1 = local_af8[bVar1].field_0.field_0.a;
          pcVar5[uVar12].color_values[lVar14].field_0.field_0.a = bVar1;
          local_b38[lVar14 * 4] = bVar2;
          local_b38[lVar14 * 4 + 1] = bVar3;
          local_b38[lVar14 * 4 + 2] = bVar4;
          local_b38[lVar14 * 4 + 3] = bVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        local_ac0 = data;
        if (local_a70.m_alternate_rounding == true) {
          uVar12 = 0xffffffffffffffff;
          do {
            local_b38[uVar12 + 5] =
                 (byte)(((uint)local_b38[uVar12 + 0xd] + (uint)local_b38[uVar12 + 1] * 2 + 1) / 3);
            local_b38[uVar12 + 9] =
                 (byte)(((uint)local_b38[uVar12 + 1] + (uint)local_b38[uVar12 + 0xd] * 2 + 1) / 3);
            uVar12 = uVar12 + 1;
          } while (uVar12 < 2);
        }
        local_a50.m_perceptual = (this->m_params).m_perceptual;
        iVar19 = (uint)local_b38[0] - (uint)local_b38[0xc];
        iVar15 = (uint)local_b38[1] - (uint)local_b38[0xd];
        iVar20 = iVar19 * 8;
        iVar9 = iVar15 * 0x19;
        if (local_a50.m_perceptual == false) {
          iVar20 = iVar19;
          iVar9 = iVar15;
        }
        local_9f8[0] = 1.15;
        local_9f8[1] = 1.1285714;
        local_9f8[2] = 1.1071428;
        local_9f8[3] = 1.0857142;
        local_9f8[4] = 1.0642858;
        local_9f8[5] = 1.0428572;
        local_9f8[6] = 1.0214286;
        local_9f8[7] = 1.0;
        local_a98 = (ulong)local_b28->blocks[0].m_size;
        if (local_a98 != 0) {
          local_aa0 = local_b28->blocks[0].m_p;
          local_a88 = local_b08->m_blocks;
          local_aa8 = (local_b08->m_block_weights).m_p;
          local_ab0 = (local_b08->m_block_encodings).m_p;
          local_ab8 = local_b08->m_block_selectors[0].m_p;
          uVar12 = 0;
          do {
            local_a90 = uVar12;
            local_b00 = (ulong)local_aa0[uVar12];
            uVar13 = (uint)(long)(local_aa8[local_b00] *
                                 (float)((((uint)local_b38[2] - (uint)local_b38[0xe]) *
                                          ((uint)local_b38[2] - (uint)local_b38[0xe]) +
                                          iVar20 * iVar19 + iVar9 * iVar15) / 2000));
            uVar11 = 0x800;
            if (uVar13 < 0x800) {
              uVar11 = uVar13;
            }
            if (uVar13 == 0) {
              uVar11 = 1;
            }
            lVar14 = 0;
            uVar16 = 0;
            do {
              local_a78 = uVar16;
              local_a80 = lVar14;
              uVar13 = 0xffffffff;
              lVar21 = 0;
              uVar22 = 0;
              do {
                bVar1 = 3 - (&g_dxt1_to_linear)[lVar21];
                if (local_a70.m_reordered == false) {
                  bVar1 = (&g_dxt1_to_linear)[lVar21];
                }
                uVar25 = (ulong)bVar1;
                iVar18 = (uint)local_a88[local_b00][lVar14].field_0.field_0.r -
                         (uint)local_b38[uVar25 * 4];
                iVar26 = (uint)local_a88[local_b00][lVar14].field_0.field_0.g -
                         (uint)local_b38[uVar25 * 4 + 1];
                iVar23 = (uint)local_a88[local_b00][lVar14].field_0.field_0.b -
                         (uint)local_b38[uVar25 * 4 + 2];
                iVar6 = iVar26 * 0x19;
                if (local_a50.m_perceptual == false) {
                  iVar6 = iVar26;
                }
                iVar27 = iVar18 * 8;
                if (local_a50.m_perceptual == false) {
                  iVar27 = iVar18;
                }
                uVar24 = iVar23 * iVar23 + iVar27 * iVar18 + iVar6 * iVar26;
                if (uVar24 < uVar13) {
                  uVar22 = (uint)bVar1;
                  uVar13 = uVar24;
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 != 4);
              uVar16 = (ulong)(uVar22 | (int)uVar16 << 2);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x10);
            local_ab8[local_b00] =
                 (long)((float)(int)uVar11 * local_9f8[local_ab0[local_b00]]) & 0xffffffffU |
                 uVar16 << 0x20;
            uVar12 = uVar12 + 1;
          } while (uVar12 != local_a98);
        }
        local_a50.m_alpha_comp_index = 0;
        local_a50.m_highest_quality = true;
        local_a50.m_pSelectors = (uint8 *)local_b18.m_p;
        local_a50.m_pPixels = (local_b28->pixels).m_p;
        local_a50.m_num_pixels = (local_b28->pixels).m_size;
        local_a50.m_dxt1_selectors = true;
        local_a50.m_error_to_beat = local_a70.m_error;
        local_a50.m_block_index = uVar17;
        bVar10 = dxt_endpoint_refiner::refine(&local_a08,&local_a50,&local_a18);
        if (bVar10) {
          auVar7._8_4_ = 0;
          auVar7._0_2_ = local_a18.m_low_color;
          auVar7._2_2_ = local_a18.m_high_color;
          auVar7._4_4_ = local_a18._4_4_;
          auVar7._12_2_ = local_a18._6_2_;
          auVar8._8_2_ = local_a18._4_2_;
          auVar8._0_2_ = local_a18.m_low_color;
          auVar8._2_2_ = local_a18.m_high_color;
          auVar8._4_4_ = local_a18._4_4_;
          auVar8._10_4_ = auVar7._10_4_;
          auVar28._6_10_ = SUB1610(ZEXT616(auVar8._8_6_) << 0x40,6);
          auVar28._4_2_ = local_a18.m_high_color;
          auVar28._0_2_ = local_a18.m_low_color;
          auVar28._2_2_ = 0;
          local_b28->first_endpoint = (int)auVar28._0_8_;
          local_b28->second_endpoint = (int)((ulong)auVar28._0_8_ >> 0x20);
        }
        uVar11 = (local_b08->m_color_clusters).m_size;
        this = local_b08;
      }
      data = (uint64)(uVar17 + local_b1c);
    } while (uVar17 + local_b1c < uVar11);
    if ((uint8 *)local_b18.m_p != (uint8 *)0x0) {
      crnlib_free(local_b18.m_p);
    }
  }
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&local_9d0);
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task(uint64 data, void*)
    {
        const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        dxt1_endpoint_optimizer optimizer;
        dxt_endpoint_refiner refiner;
        crnlib::vector<uint8> selectors;

        for (uint cluster_index = (uint)data; cluster_index < m_color_clusters.size(); cluster_index += num_tasks)
        {
            color_cluster& cluster = m_color_clusters[cluster_index];
            if (cluster.pixels.empty())
            {
                continue;
            }

            dxt1_endpoint_optimizer::params params;
            params.m_block_index = cluster_index;
            params.m_pPixels = cluster.pixels.get_ptr();
            params.m_num_pixels = cluster.pixels.size();
            params.m_pixels_have_alpha = false;
            params.m_use_alpha_blocks = false;
            params.m_perceptual = m_params.m_perceptual;
            params.m_quality = cCRNDXTQualityUber;
            params.m_endpoint_caching = false;

            dxt1_endpoint_optimizer::results results;
            selectors.resize(params.m_num_pixels);
            results.m_pSelectors = selectors.get_ptr();

            optimizer.compute(params, results);
            cluster.first_endpoint = results.m_low_color;
            cluster.second_endpoint = results.m_high_color;
            color_quad_u8 block_values[4], color_values[4];
            dxt1_block::get_block_colors4(block_values, cluster.first_endpoint, cluster.second_endpoint);
            for (uint i = 0; i < 4; i++)
            {
                color_values[i] = cluster.color_values[i] = block_values[g_dxt1_from_linear[i]];
            }
            for (uint c = 0; results.m_alternate_rounding && c < 3; c++)
            {
                color_values[1].c[c] = ((color_values[0].c[c] << 1) + color_values[3].c[c] + 1) / 3;
                color_values[2].c[c] = ((color_values[3].c[c] << 1) + color_values[0].c[c] + 1) / 3;
            }

            uint endpoint_weight = color::color_distance(m_params.m_perceptual, color_values[0], color_values[3], false) / 2000;
            float encoding_weight[8];
            for (uint i = 0; i < 8; i++)
            {
                encoding_weight[i] = math::lerp(1.15f, 1.0f, i / 7.0f);
            }

            crnlib::vector<uint>& blocks = cluster.blocks[cColor];
            for (uint i = 0; i < blocks.size(); i++)
            {
                uint b = blocks[i];
                uint weight = (uint)(math::clamp<uint>(endpoint_weight * m_block_weights[b], 1, 2048) * encoding_weight[m_block_encodings[b]]);
                uint32 selector = 0;
                for (uint p = 0; p < 16; p++)
                {
                    uint error_best = cUINT32_MAX;
                    uint8 s_best = 0;
                    for (uint8 t = 0; t < 4; t++)
                    {
                        uint8 s = results.m_reordered ? 3 - g_dxt1_to_linear[t] : g_dxt1_to_linear[t];
                        uint error = color::color_distance(m_params.m_perceptual, (color_quad_u8&)m_blocks[b][p], color_values[s], false);
                        if (error < error_best)
                        {
                            s_best = s;
                            error_best = error;
                        }
                    }
                    selector = selector << 2 | s_best;
                }
                m_block_selectors[cColor][b] = (uint64)selector << 32 | weight;
            }

            dxt_endpoint_refiner::params refinerParams;
            dxt_endpoint_refiner::results refinerResults;
            refinerParams.m_perceptual = m_params.m_perceptual;
            refinerParams.m_pSelectors = selectors.get_ptr();
            refinerParams.m_pPixels = cluster.pixels.get_ptr();
            refinerParams.m_num_pixels = cluster.pixels.size();
            refinerParams.m_dxt1_selectors = true;
            refinerParams.m_error_to_beat = results.m_error;
            refinerParams.m_block_index = cluster_index;
            if (refiner.refine(refinerParams, refinerResults))
            {
                cluster.first_endpoint = refinerResults.m_low_color;
                cluster.second_endpoint = refinerResults.m_high_color;
            }
        }
    }